

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O0

void __thiscall
irr::scene::CSkinnedMesh::calculateTangents
          (CSkinnedMesh *this,vector3df *normal,vector3df *tangent,vector3df *binormal,
          vector3df *vt1,vector3df *vt2,vector3df *vt3,vector2df *tc1,vector2df *tc2,vector2df *tc3)

{
  vector3d<float> *in_RCX;
  vector3d<float> *in_RDX;
  vector3d<float> *in_RSI;
  float fVar1;
  vector3d<float> vVar2;
  float *in_stack_00000010;
  float *in_stack_00000018;
  float *in_stack_00000020;
  vector3df txb;
  f32 deltaY2;
  f32 deltaY1;
  f32 deltaX2;
  f32 deltaX1;
  vector3df v2;
  vector3df v1;
  vector3d<float> *in_stack_fffffffffffffe78;
  vector3d<float> *p;
  vector3d<float> *in_stack_fffffffffffffe80;
  float local_178;
  vector3d<float> local_16c;
  vector3d<float> local_160;
  vector3d<float> local_150;
  undefined8 local_140;
  float local_138;
  vector3d<float> local_130;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  float local_100;
  float local_fc;
  vector3d<float> local_f8;
  vector3d<float> local_e8;
  undefined8 local_d8;
  float local_d0;
  vector3d<float> local_c8;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  float local_98;
  float local_94;
  vector3d<float> local_90;
  undefined8 local_80;
  float local_78;
  vector3d<float> local_70;
  vector3d<float> local_60;
  vector3d<float> local_50;
  undefined8 local_40;
  float local_38;
  vector3d<float> *local_20;
  vector3d<float> *local_18;
  vector3d<float> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  vVar2 = core::vector3d<float>::operator-(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_50.Z = vVar2.Z;
  local_38 = local_50.Z;
  local_50._0_8_ = vVar2._0_8_;
  local_40._0_4_ = local_50.X;
  local_40._4_4_ = local_50.Y;
  local_50 = vVar2;
  vVar2 = core::vector3d<float>::operator-(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_70.Z = vVar2.Z;
  local_60.Z = local_70.Z;
  local_70._0_8_ = vVar2._0_8_;
  local_60.X = local_70.X;
  local_60.Y = local_70.Y;
  p = &local_60;
  local_70 = vVar2;
  vVar2 = core::vector3d<float>::crossProduct(in_stack_fffffffffffffe80,p);
  local_90.Z = vVar2.Z;
  local_78 = local_90.Z;
  local_90._0_8_ = vVar2._0_8_;
  local_80._0_4_ = local_90.X;
  local_80._4_4_ = local_90.Y;
  local_10->Z = local_90.Z;
  local_10->X = local_90.X;
  local_10->Y = local_90.Y;
  local_90 = vVar2;
  core::vector3d<float>::normalize(p);
  local_94 = *in_stack_00000010 - *in_stack_00000018;
  local_98 = *in_stack_00000020 - *in_stack_00000010;
  vVar2 = core::vector3d<float>::operator*(in_stack_fffffffffffffe80,(float)((ulong)p >> 0x20));
  local_c8.Z = vVar2.Z;
  local_b0 = local_c8.Z;
  local_c8._0_8_ = vVar2._0_8_;
  local_b8._0_4_ = local_c8.X;
  local_b8._4_4_ = local_c8.Y;
  local_c8 = vVar2;
  vVar2 = core::vector3d<float>::operator*(in_stack_fffffffffffffe80,(float)((ulong)p >> 0x20));
  local_e8.Z = vVar2.Z;
  local_d0 = local_e8.Z;
  local_e8._0_8_ = vVar2._0_8_;
  local_d8._0_4_ = local_e8.X;
  local_d8._4_4_ = local_e8.Y;
  local_e8 = vVar2;
  vVar2 = core::vector3d<float>::operator-(in_stack_fffffffffffffe80,p);
  local_f8.Z = vVar2.Z;
  local_a0 = local_f8.Z;
  local_f8._0_8_ = vVar2._0_8_;
  local_a8._0_4_ = local_f8.X;
  local_a8._4_4_ = local_f8.Y;
  local_20->Z = local_f8.Z;
  local_20->X = local_f8.X;
  local_20->Y = local_f8.Y;
  local_f8 = vVar2;
  core::vector3d<float>::normalize(p);
  local_fc = in_stack_00000010[1] - in_stack_00000018[1];
  local_100 = in_stack_00000020[1] - in_stack_00000010[1];
  vVar2 = core::vector3d<float>::operator*(in_stack_fffffffffffffe80,(float)((ulong)p >> 0x20));
  local_130.Z = vVar2.Z;
  local_118 = local_130.Z;
  local_130._0_8_ = vVar2._0_8_;
  local_120._0_4_ = local_130.X;
  local_120._4_4_ = local_130.Y;
  local_130 = vVar2;
  vVar2 = core::vector3d<float>::operator*(in_stack_fffffffffffffe80,(float)((ulong)p >> 0x20));
  local_150.Z = vVar2.Z;
  local_138 = local_150.Z;
  local_150._0_8_ = vVar2._0_8_;
  local_140._0_4_ = local_150.X;
  local_140._4_4_ = local_150.Y;
  local_150 = vVar2;
  vVar2 = core::vector3d<float>::operator-(in_stack_fffffffffffffe80,p);
  local_160.Z = vVar2.Z;
  local_108 = local_160.Z;
  local_160._0_8_ = vVar2._0_8_;
  local_110._0_4_ = local_160.X;
  local_110._4_4_ = local_160.Y;
  local_18->Z = local_160.Z;
  local_18->X = local_160.X;
  local_18->Y = local_160.Y;
  local_160 = vVar2;
  core::vector3d<float>::normalize(p);
  vVar2 = core::vector3d<float>::crossProduct(in_stack_fffffffffffffe80,p);
  local_16c._0_8_ = vVar2._0_8_;
  local_178 = vVar2.Z;
  local_16c.Z = local_178;
  fVar1 = core::vector3d<float>::dotProduct(&local_16c,local_10);
  if (fVar1 < 0.0) {
    core::vector3d<float>::operator*=(local_18,-1.0);
    core::vector3d<float>::operator*=(local_20,-1.0);
  }
  return;
}

Assistant:

void CSkinnedMesh::calculateTangents(
		core::vector3df &normal,
		core::vector3df &tangent,
		core::vector3df &binormal,
		const core::vector3df &vt1, const core::vector3df &vt2, const core::vector3df &vt3, // vertices
		const core::vector2df &tc1, const core::vector2df &tc2, const core::vector2df &tc3) // texture coords
{
	core::vector3df v1 = vt1 - vt2;
	core::vector3df v2 = vt3 - vt1;
	normal = v2.crossProduct(v1);
	normal.normalize();

	// binormal

	f32 deltaX1 = tc1.X - tc2.X;
	f32 deltaX2 = tc3.X - tc1.X;
	binormal = (v1 * deltaX2) - (v2 * deltaX1);
	binormal.normalize();

	// tangent

	f32 deltaY1 = tc1.Y - tc2.Y;
	f32 deltaY2 = tc3.Y - tc1.Y;
	tangent = (v1 * deltaY2) - (v2 * deltaY1);
	tangent.normalize();

	// adjust

	core::vector3df txb = tangent.crossProduct(binormal);
	if (txb.dotProduct(normal) < 0.0f) {
		tangent *= -1.0f;
		binormal *= -1.0f;
	}
}